

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest.cpp
# Opt level: O0

bool __thiscall TxRequestTracker::Impl::MakeCompleted(Impl *this,Iter<ByTxHash> it)

{
  long lVar1;
  bool bVar2;
  State SVar3;
  iterator it_00;
  Impl *in_RDI;
  long in_FS_OFFSET;
  Iter<ByTxHash> in_stack_00000008;
  uint256 txhash;
  Announcement *in_stack_ffffffffffffff78;
  undefined6 in_stack_ffffffffffffff80;
  undefined1 in_stack_ffffffffffffff86;
  undefined1 in_stack_ffffffffffffff87;
  Impl *this_00;
  bool local_61;
  Impl *in_stack_ffffffffffffffa0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  boost::multi_index::
  multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
  ::get<(anonymous_namespace)::ByTxHash>
            ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
              *)in_stack_ffffffffffffff78);
  it_00 = boost::multi_index::detail::
          ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::end((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
                 *)this_00);
  bVar2 = boost::operators_impl::operator!=
                    ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                      *)in_RDI,
                     (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                      *)CONCAT17(in_stack_ffffffffffffff87,
                                 CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)));
  if (!bVar2) {
    __assert_fail("it != m_index.get<ByTxHash>().end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/txrequest.cpp"
                  ,0x1d4,"bool TxRequestTracker::Impl::MakeCompleted(Iter<ByTxHash>)");
  }
  boost::operators_impl::
  dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
  ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                *)in_stack_ffffffffffffff78);
  SVar3 = anon_unknown.dwarf_9af08c::Announcement::GetState(in_stack_ffffffffffffff78);
  if (SVar3 == COMPLETED) {
    local_61 = true;
  }
  else {
    bVar2 = IsOnlyNonCompleted(in_stack_ffffffffffffffa0,in_stack_00000008);
    if (bVar2) {
      boost::operators_impl::
      dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
      ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                    *)in_stack_ffffffffffffff78);
      do {
        Erase<(anonymous_namespace)::ByTxHash>
                  (in_stack_ffffffffffffffa0,(Iter<(anonymous_namespace)::ByTxHash>)it_00.node);
        boost::multi_index::
        multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
        ::get<(anonymous_namespace)::ByTxHash>
                  ((multi_index_container<(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>
                    *)in_stack_ffffffffffffff78);
        boost::multi_index::detail::
        ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
        ::end((ordered_index_impl<(anonymous_namespace)::ByTxHashViewExtractor,_std::less<std::tuple<const_uint256_&,_(anonymous_namespace)::State,_unsigned_long>_>,_boost::multi_index::detail::nth_layer<2,_(anonymous_namespace)::Announcement,_(anonymous_namespace)::Announcement_Indices,_std::allocator<(anonymous_namespace)::Announcement>_>,_boost::mpl::v_item<(anonymous_namespace)::ByTxHash,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_non_unique_tag,_boost::multi_index::detail::null_augment_policy>
               *)this_00);
        bVar2 = boost::operators_impl::operator!=
                          ((bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                            *)in_RDI,
                           (bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>
                            *)CONCAT17(in_stack_ffffffffffffff87,
                                       CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)
                                      ));
        in_stack_ffffffffffffff87 = false;
        if (bVar2) {
          boost::operators_impl::
          dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
          ::operator->((dereferenceable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_const_(anonymous_namespace)::Announcement_*,_boost::operators_impl::decrementable<boost::multi_index::detail::bidir_node_iterator<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<(anonymous_namespace)::Announcement,_std::allocator<(anonymous_namespace)::Announcement>_>_>_>_>,_boost::operators_impl::iterator_helper<std::bidirectional_iterator_tag,_(anonymous_namespace)::Announcement,_long,_const_(anonymous_namespace)::Announcement_*,_const_(anonymous_namespace)::Announcement_&>_>_>
                        *)in_stack_ffffffffffffff78);
          in_stack_ffffffffffffff87 =
               ::operator==((base_blob<256U> *)in_RDI,
                            (base_blob<256U> *)
                            CONCAT17(in_stack_ffffffffffffff87,
                                     CONCAT16(in_stack_ffffffffffffff86,in_stack_ffffffffffffff80)))
          ;
        }
      } while ((bool)in_stack_ffffffffffffff87 != false);
      local_61 = false;
    }
    else {
      ChangeAndReselect(this_00,(Iter<ByTxHash>)it_00.node,(State)((ulong)in_RDI >> 0x38));
      local_61 = true;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_61;
}

Assistant:

bool MakeCompleted(Iter<ByTxHash> it)
    {
        assert(it != m_index.get<ByTxHash>().end());

        // Nothing to be done if it's already COMPLETED.
        if (it->GetState() == State::COMPLETED) return true;

        if (IsOnlyNonCompleted(it)) {
            // This is the last non-COMPLETED announcement for this txhash. Delete all.
            uint256 txhash = it->m_txhash;
            do {
                it = Erase<ByTxHash>(it);
            } while (it != m_index.get<ByTxHash>().end() && it->m_txhash == txhash);
            return false;
        }

        // Mark the announcement COMPLETED, and select the next best announcement (the first CANDIDATE_READY) if
        // needed.
        ChangeAndReselect(it, State::COMPLETED);

        return true;
    }